

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

re_status_t __thiscall
CRegexParser::compile
          (CRegexParser *this,char *expr_str,size_t exprlen,re_compiled_pattern_base *pat)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  ulong uVar4;
  re_machine *in_RCX;
  char *in_RSI;
  CRegexParser *in_RDI;
  bool bVar5;
  int var_id;
  int shortest_1;
  re_machine interval_machine;
  int max_val;
  int min_val;
  re_machine closure_machine;
  int shortest;
  wchar_t tmp;
  wchar_t ch2;
  wchar_t ch;
  int is_exclusive;
  int back_assertion;
  int neg_assertion;
  int pos_assertion;
  int capturing;
  size_t exprchars;
  utf8_ptr expr;
  anon_struct_36_7_ed371931 group_stack [20];
  int group_stack_level;
  re_machine new_machine;
  re_machine alter_machine;
  re_machine cur_machine;
  wchar_t in_stack_fffffffffffffc48;
  wchar_t in_stack_fffffffffffffc4c;
  wchar_t in_stack_fffffffffffffc50;
  wchar_t in_stack_fffffffffffffc54;
  int in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5c;
  undefined1 in_stack_fffffffffffffc5d;
  undefined1 in_stack_fffffffffffffc5e;
  undefined1 in_stack_fffffffffffffc5f;
  wchar_t in_stack_fffffffffffffc60;
  uint in_stack_fffffffffffffc64;
  re_machine *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  re_machine *in_stack_fffffffffffffc78;
  CRegexParser *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  wchar_t in_stack_fffffffffffffc98;
  re_state_id in_stack_fffffffffffffc9c;
  re_state_id in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  re_state_id local_354;
  re_state_id in_stack_fffffffffffffcb0;
  uint in_stack_fffffffffffffcb4;
  wchar_t in_stack_fffffffffffffcb8;
  wchar_t in_stack_fffffffffffffcbc;
  wchar_t in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  uint in_stack_fffffffffffffcc8;
  uint in_stack_fffffffffffffccc;
  uint local_330;
  uint local_32c;
  ulong local_328;
  utf8_ptr local_320;
  re_machine local_318 [2];
  uint auStack_308 [177];
  int local_44;
  re_machine local_40;
  re_machine local_38;
  re_machine local_30;
  re_machine *local_28;
  char *local_18;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  utf8_ptr::utf8_ptr(&local_320);
  reset((CRegexParser *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  local_28[1].final = 0;
  local_28[2].init = 0;
  local_328 = utf8_ptr::s_len((char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                              CONCAT17(in_stack_fffffffffffffc5f,
                                       CONCAT16(in_stack_fffffffffffffc5e,
                                                CONCAT15(in_stack_fffffffffffffc5d,
                                                         CONCAT14(in_stack_fffffffffffffc5c,
                                                                  in_stack_fffffffffffffc58)))));
  *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xfb | 4;
  *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xf7 | 8;
  *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xfe | 1;
  *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xfd;
  build_null_machine(in_RDI,&local_30);
  build_null_machine(in_RDI,&local_38);
  local_44 = 0;
  utf8_ptr::set(&local_320,local_18);
LAB_003826aa:
  if (local_328 == 0) goto LAB_0038395d;
  wVar1 = utf8_ptr::getch((utf8_ptr *)0x3826c6);
  in_stack_fffffffffffffc80 = (CRegexParser *)(ulong)(uint)(wVar1 + L'\xffffffdc');
  switch(in_stack_fffffffffffffc80) {
  case (CRegexParser *)0x0:
    if (((local_328 < 2) ||
        (wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                    CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)),
        wVar1 == L')')) ||
       (wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)),
       wVar1 == L'|')) {
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      concat_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                  (re_machine *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,
                                             CONCAT14(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)))),
                  (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      goto LAB_00383928;
    }
    break;
  case (CRegexParser *)0x1:
    utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    uVar4 = local_328 - 1;
    if (uVar4 == 0) {
      utf8_ptr::dec((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      goto LAB_00383928;
    }
    wVar1 = utf8_ptr::getch((utf8_ptr *)0x38306c);
    in_stack_fffffffffffffc68 = (re_machine *)(ulong)(uint)(wVar1 + L'\xffffffcf');
    local_328 = uVar4;
    switch(in_stack_fffffffffffffc68) {
    case (re_machine *)0x0:
    case (re_machine *)0x1:
    case (re_machine *)0x2:
    case (re_machine *)0x3:
    case (re_machine *)0x4:
    case (re_machine *)0x5:
    case (re_machine *)0x6:
    case (re_machine *)0x7:
    case (re_machine *)0x8:
      wVar1 = utf8_ptr::getch((utf8_ptr *)0x3830a1);
      value_of_digit(wVar1);
      build_group_matcher((CRegexParser *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          (re_machine *)
                          CONCAT17(in_stack_fffffffffffffc5f,
                                   CONCAT16(in_stack_fffffffffffffc5e,
                                            CONCAT15(in_stack_fffffffffffffc5d,
                                                     CONCAT14(in_stack_fffffffffffffc5c,
                                                              in_stack_fffffffffffffc58)))),
                          in_stack_fffffffffffffc54);
      break;
    default:
      utf8_ptr::getch((utf8_ptr *)0x3832a1);
      build_char((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (re_machine *)
                 CONCAT17(in_stack_fffffffffffffc5f,
                          CONCAT16(in_stack_fffffffffffffc5e,
                                   CONCAT15(in_stack_fffffffffffffc5d,
                                            CONCAT14(in_stack_fffffffffffffc5c,
                                                     in_stack_fffffffffffffc58)))),
                 in_stack_fffffffffffffc54);
      break;
    case (re_machine *)0xb:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      concat_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                  (re_machine *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,
                                             CONCAT14(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)))),
                  (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      goto LAB_00383928;
    case (re_machine *)0xd:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      concat_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                  (re_machine *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,
                                             CONCAT14(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)))),
                  (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      goto LAB_00383928;
    case (re_machine *)0x11:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      concat_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                  (re_machine *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,
                                             CONCAT14(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)))),
                  (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      goto LAB_00383928;
    case (re_machine *)0x13:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      break;
    case (re_machine *)0x22:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      break;
    case (re_machine *)0x25:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      break;
    case (re_machine *)0x26:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      break;
    case (re_machine *)0x31:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      concat_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                  (re_machine *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,
                                             CONCAT14(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)))),
                  (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      goto LAB_00383928;
    case (re_machine *)0x33:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      break;
    case (re_machine *)0x42:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      break;
    case (re_machine *)0x45:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      break;
    case (re_machine *)0x46:
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
    }
    goto LAB_00383563;
  default:
    break;
  case (CRegexParser *)0x4:
    local_32c = 1;
    local_330 = 0;
    in_stack_fffffffffffffccc = 0;
    in_stack_fffffffffffffcc8 = 0;
    if (0x14 < local_44) {
      return RE_STATUS_GROUP_NESTING_TOO_DEEP;
    }
    *(re_machine *)((long)local_318 + (long)local_44 * 0x24) = local_30;
    *(re_machine *)((long)local_318 + (long)local_44 * 0x24 + 8) = local_38;
    auStack_308[(long)local_44 * 9] = local_28[1].final;
    if ((2 < local_328) &&
       (wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)),
       wVar1 == L'?')) {
      wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      in_stack_fffffffffffffc78 = (re_machine *)(ulong)(uint)(wVar1 + L'\xffffffdf');
      switch(in_stack_fffffffffffffc78) {
      case (re_machine *)0x0:
        in_stack_fffffffffffffccc = 1;
        local_32c = 0;
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_328 = local_328 - 2;
        break;
      default:
        break;
      case (re_machine *)0x19:
        local_32c = 0;
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_328 = local_328 - 2;
        break;
      case (re_machine *)0x1b:
        if ((3 < local_328) &&
           ((wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50
                                                ),
                                        CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48
                                                )), wVar1 == L'=' ||
            (wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50
                                                ),
                                        CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48
                                                )), wVar1 == L'!')))) {
          in_stack_fffffffffffffcc8 = 1;
          local_32c = 0;
          wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          if (wVar1 != L'=') {
            in_stack_fffffffffffffccc = 1;
          }
          local_330 = (uint)(wVar1 == L'=');
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          local_328 = local_328 - 3;
        }
        break;
      case (re_machine *)0x1c:
        local_330 = 1;
        local_32c = 0;
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_328 = local_328 - 2;
      }
    }
    auStack_308[(long)local_44 * 9 + 1] = local_32c;
    auStack_308[(long)local_44 * 9 + 3] = local_330;
    auStack_308[(long)local_44 * 9 + 2] = in_stack_fffffffffffffccc;
    auStack_308[(long)local_44 * 9 + 4] = in_stack_fffffffffffffcc8;
    if (local_32c != 0) {
      local_28[1].final = local_28[1].final + 1;
    }
    local_44 = local_44 + 1;
    build_null_machine(in_RDI,&local_30);
    build_null_machine(in_RDI,&local_38);
    goto LAB_00383928;
  case (CRegexParser *)0x5:
    goto LAB_00382b3b;
  case (CRegexParser *)0xa:
    build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                  (re_machine *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,
                                             CONCAT14(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)))),
                  in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
    goto LAB_00383563;
  case (CRegexParser *)0x18:
    if (3 < local_328) {
      utf8_ptr::getptr(&local_320);
      iVar2 = memicmp((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (void *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      if (iVar2 != 0) goto LAB_00382d64;
LAB_00382d95:
      *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xf7;
LAB_00382fb3:
      while( true ) {
        bVar5 = false;
        if (local_328 != 0) {
          wVar1 = utf8_ptr::getch((utf8_ptr *)0x382fd1);
          bVar5 = wVar1 != L'>';
        }
        if (!bVar5) break;
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_328 = local_328 - 1;
      }
      in_stack_fffffffffffffc77 = 0;
      goto LAB_00383928;
    }
LAB_00382d64:
    if (9 < local_328) {
      utf8_ptr::getptr(&local_320);
      iVar2 = memicmp((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (void *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      if (iVar2 == 0) goto LAB_00382d95;
    }
    if (3 < local_328) {
      utf8_ptr::getptr(&local_320);
      iVar2 = memicmp((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (void *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      if (iVar2 != 0) goto LAB_00382ddf;
LAB_00382e10:
      *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xf7 | 8;
      goto LAB_00382fb3;
    }
LAB_00382ddf:
    if (0xb < local_328) {
      utf8_ptr::getptr(&local_320);
      iVar2 = memicmp((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (void *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      if (iVar2 == 0) goto LAB_00382e10;
    }
    if (4 < local_328) {
      utf8_ptr::getptr(&local_320);
      iVar2 = memicmp((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (void *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      if (iVar2 == 0) {
        *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xfb | 4;
        goto LAB_00382fb3;
      }
    }
    if (4 < local_328) {
      utf8_ptr::getptr(&local_320);
      iVar2 = memicmp((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (void *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      if (iVar2 == 0) {
        *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xfb;
        goto LAB_00382fb3;
      }
    }
    if (5 < local_328) {
      utf8_ptr::getptr(&local_320);
      iVar2 = memicmp((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (void *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      if (iVar2 == 0) {
        *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xfe | 1;
        *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xfd | 2;
        goto LAB_00382fb3;
      }
    }
    if (7 < local_328) {
      utf8_ptr::getptr(&local_320);
      iVar2 = memicmp((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (void *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      if (iVar2 == 0) {
        *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xfe;
        *(byte *)&local_28[2].final = (byte)local_28[2].final & 0xfd | 2;
        goto LAB_00382fb3;
      }
    }
    iVar2 = compile_char_class_expr
                      ((CRegexParser *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                       ,(utf8_ptr *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                       (size_t *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       (re_machine *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    if (iVar2 != 0) goto LAB_00383563;
    break;
  case (CRegexParser *)0x37:
    in_stack_fffffffffffffcc4 = 0;
    in_RDI->range_buf_cnt_ = 0;
    utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    uVar4 = local_328 - 1;
    if ((uVar4 != 0) && (wVar1 = utf8_ptr::getch((utf8_ptr *)0x38332b), wVar1 == L'^')) {
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      in_stack_fffffffffffffcc4 = 1;
      uVar4 = local_328 - 2;
    }
    local_328 = uVar4;
    if ((local_328 != 0) && (wVar1 = utf8_ptr::getch((utf8_ptr *)0x383371), wVar1 == L']')) {
      add_range_char((CRegexParser *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     in_stack_fffffffffffffc4c);
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      local_328 = local_328 - 1;
    }
    uVar4 = local_328;
    if ((local_328 != 0) && (wVar1 = utf8_ptr::getch((utf8_ptr *)0x3833be), wVar1 == L'-')) {
      add_range_char((CRegexParser *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     in_stack_fffffffffffffc4c);
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      uVar4 = local_328 - 1;
    }
    while( true ) {
      local_328 = uVar4;
      in_stack_fffffffffffffc64 = in_stack_fffffffffffffc64 & 0xffffff;
      if (local_328 != 0) {
        wVar1 = utf8_ptr::getch((utf8_ptr *)0x383413);
        in_stack_fffffffffffffc64 = CONCAT13(wVar1 != L']',(int3)in_stack_fffffffffffffc64);
      }
      if ((char)(in_stack_fffffffffffffc64 >> 0x18) == '\0') break;
      in_stack_fffffffffffffcc0 = utf8_ptr::getch((utf8_ptr *)0x383437);
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      if ((local_328 - 1 == 0) || (wVar1 = utf8_ptr::getch((utf8_ptr *)0x383478), wVar1 != L'-')) {
        add_range_char((CRegexParser *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)
                       ,in_stack_fffffffffffffc4c);
        uVar4 = local_328 - 1;
      }
      else {
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        uVar4 = local_328 - 2;
        if (local_328 - 2 != 0) {
          wVar1 = utf8_ptr::getch((utf8_ptr *)0x3834ba);
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          in_stack_fffffffffffffcbc = wVar1;
          if (wVar1 < in_stack_fffffffffffffcc0) {
            in_stack_fffffffffffffcb8 = in_stack_fffffffffffffcc0;
            in_stack_fffffffffffffcbc = in_stack_fffffffffffffcc0;
            in_stack_fffffffffffffcc0 = wVar1;
          }
          add_range_char((CRegexParser *)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
          uVar4 = local_328 - 3;
        }
      }
    }
    build_char_range((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                     (re_machine *)
                     CONCAT17(in_stack_fffffffffffffc5f,
                              CONCAT16(in_stack_fffffffffffffc5e,
                                       CONCAT15(in_stack_fffffffffffffc5d,
                                                CONCAT14(in_stack_fffffffffffffc5c,
                                                         in_stack_fffffffffffffc58)))),
                     in_stack_fffffffffffffc54);
    goto LAB_00383563;
  case (CRegexParser *)0x3a:
    iVar2 = is_machine_null(in_RDI,&local_30);
    if (iVar2 != 0) {
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      concat_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                  (re_machine *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,
                                             CONCAT14(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)))),
                  (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      goto LAB_00383928;
    }
    break;
  case (CRegexParser *)0x58:
    alternate_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (re_machine *)
                   CONCAT17(in_stack_fffffffffffffc5f,
                            CONCAT16(in_stack_fffffffffffffc5e,
                                     CONCAT15(in_stack_fffffffffffffc5d,
                                              CONCAT14(in_stack_fffffffffffffc5c,
                                                       in_stack_fffffffffffffc58)))),
                   (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    build_null_machine(in_RDI,&local_30);
    goto LAB_00383928;
  }
  utf8_ptr::getch((utf8_ptr *)0x38354f);
  build_char((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
             (re_machine *)
             CONCAT17(in_stack_fffffffffffffc5f,
                      CONCAT16(in_stack_fffffffffffffc5e,
                               CONCAT15(in_stack_fffffffffffffc5d,
                                        CONCAT14(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58
                                                )))),in_stack_fffffffffffffc54);
LAB_00383563:
  do {
    if (1 < local_328) {
      in_stack_fffffffffffffc60 =
           utf8_ptr::getch_at((utf8_ptr *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                              CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      if (((uint)(in_stack_fffffffffffffc60 + L'\xffffffd6') < 2) ||
         (in_stack_fffffffffffffc60 == L'?')) {
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_328 = local_328 - 1;
        in_stack_fffffffffffffc5f = false;
        if (1 < local_328) {
          wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          in_stack_fffffffffffffc5f = wVar1 == L'?';
        }
        in_stack_fffffffffffffcb4 = (uint)(byte)in_stack_fffffffffffffc5f;
        utf8_ptr::getch((utf8_ptr *)0x38361b);
        build_closure((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      (re_machine *)
                      CONCAT17(in_stack_fffffffffffffc5f,
                               CONCAT16(in_stack_fffffffffffffc5e,
                                        CONCAT15(in_stack_fffffffffffffc5d,
                                                 CONCAT14(in_stack_fffffffffffffc5c,
                                                          in_stack_fffffffffffffc58)))),
                      (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                      in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
        local_40.final = in_stack_fffffffffffffcb0;
        local_40.init = local_354;
      }
      else {
        if (in_stack_fffffffffffffc60 != L'{') goto LAB_0038390e;
        if (local_28[2].init <= local_44) {
          local_28[2].init = local_44 + 1;
        }
        in_stack_fffffffffffffc94 = local_44;
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        uVar4 = local_328 - 2;
        in_stack_fffffffffffffca4 =
             parse_int((CRegexParser *)
                       CONCAT17(in_stack_fffffffffffffc5f,
                                CONCAT16(in_stack_fffffffffffffc5e,
                                         CONCAT15(in_stack_fffffffffffffc5d,
                                                  CONCAT14(in_stack_fffffffffffffc5c,
                                                           in_stack_fffffffffffffc58)))),
                       (utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                       (size_t *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        if ((uVar4 != 0) && (wVar1 = utf8_ptr::getch((utf8_ptr *)0x3837e0), wVar1 == L',')) {
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          in_stack_fffffffffffffca4 =
               parse_int((CRegexParser *)
                         CONCAT17(in_stack_fffffffffffffc5f,
                                  CONCAT16(in_stack_fffffffffffffc5e,
                                           CONCAT15(in_stack_fffffffffffffc5d,
                                                    CONCAT14(in_stack_fffffffffffffc5c,
                                                             in_stack_fffffffffffffc58)))),
                         (utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (size_t *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          uVar4 = local_328 - 3;
        }
        while( true ) {
          local_328 = uVar4;
          in_stack_fffffffffffffc5d = false;
          if (local_328 != 0) {
            wVar1 = utf8_ptr::getch((utf8_ptr *)0x38384e);
            in_stack_fffffffffffffc5d = wVar1 != L'}';
          }
          if ((bool)in_stack_fffffffffffffc5d == false) break;
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                        (size_t *)
                        CONCAT17(in_stack_fffffffffffffc5f,
                                 CONCAT16(in_stack_fffffffffffffc5e,
                                          CONCAT15(in_stack_fffffffffffffc5d,
                                                   CONCAT14(in_stack_fffffffffffffc5c,
                                                            in_stack_fffffffffffffc58)))));
          uVar4 = local_328;
        }
        wVar1 = L'\0';
        if ((1 < local_328) &&
           (wVar3 = utf8_ptr::getch_at((utf8_ptr *)
                                       CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)
                                       ,CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48
                                                )), wVar3 == L'?')) {
          wVar1 = L'\x01';
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          local_328 = local_328 - 1;
        }
        in_stack_fffffffffffffc48 = wVar1;
        in_stack_fffffffffffffc98 = in_stack_fffffffffffffc48;
        build_interval((CRegexParser *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70)
                       ,in_stack_fffffffffffffc68,
                       (re_machine *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       CONCAT13(in_stack_fffffffffffffc5f,
                                CONCAT12(in_stack_fffffffffffffc5e,
                                         CONCAT11(in_stack_fffffffffffffc5d,
                                                  in_stack_fffffffffffffc5c))),
                       in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,
                       (int)in_stack_fffffffffffffc80);
        local_40.final = in_stack_fffffffffffffca0;
        local_40.init = in_stack_fffffffffffffc9c;
      }
      while (1 < local_328) {
        wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        if (((wVar1 == L'?') ||
            (wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50
                                                ),
                                        CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48
                                                )), wVar1 == L'+')) ||
           (wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                       CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)
                                       ,CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48
                                                )), wVar1 == L'*')) {
          utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          local_328 = local_328 - 1;
        }
        else {
          wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          if (wVar1 != L'{') break;
          while( true ) {
            bVar5 = false;
            if (1 < local_328) {
              wVar1 = utf8_ptr::getch_at((utf8_ptr *)
                                         CONCAT44(in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50),
                                         CONCAT44(in_stack_fffffffffffffc4c,
                                                  in_stack_fffffffffffffc48));
              bVar5 = wVar1 != L'}';
            }
            if (!bVar5) break;
            utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))
            ;
            local_328 = local_328 - 1;
          }
          in_stack_fffffffffffffc5e = 0;
        }
      }
    }
LAB_0038390e:
    concat_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                (re_machine *)
                CONCAT17(in_stack_fffffffffffffc5f,
                         CONCAT16(in_stack_fffffffffffffc5e,
                                  CONCAT15(in_stack_fffffffffffffc5d,
                                           CONCAT14(in_stack_fffffffffffffc5c,
                                                    in_stack_fffffffffffffc58)))),
                (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
LAB_00383928:
    do {
      if (local_328 != 0) {
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_328 = local_328 - 1;
        goto LAB_003826aa;
      }
LAB_0038395d:
      if (local_44 == 0) {
        alternate_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                       ,(re_machine *)
                        CONCAT17(in_stack_fffffffffffffc5f,
                                 CONCAT16(in_stack_fffffffffffffc5e,
                                          CONCAT15(in_stack_fffffffffffffc5d,
                                                   CONCAT14(in_stack_fffffffffffffc5c,
                                                            in_stack_fffffffffffffc58)))),
                       (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        break_loops((CRegexParser *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                    (re_machine *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        remove_branch_to_branch
                  ((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (re_machine *)
                   CONCAT17(in_stack_fffffffffffffc5f,
                            CONCAT16(in_stack_fffffffffffffc5e,
                                     CONCAT15(in_stack_fffffffffffffc5d,
                                              CONCAT14(in_stack_fffffffffffffc5c,
                                                       in_stack_fffffffffffffc58)))));
        consolidate_strings(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        *local_28 = local_38;
        local_28[1].init = in_RDI->next_state_;
        if (10 < local_28[1].final) {
          local_28[1].final = 10;
        }
        if (0x14 < local_28[2].init) {
          local_28[2].init = 0x14;
        }
        return RE_STATUS_SUCCESS;
      }
LAB_00382b3b:
    } while (local_44 == 0);
    local_44 = local_44 + -1;
    if (auStack_308[(long)local_44 * 9 + 4] != 0) {
      build_special((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,
                                      CONCAT15(in_stack_fffffffffffffc5d,
                                               CONCAT14(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)))),
                    in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
      concat_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                  (re_machine *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,
                                             CONCAT14(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)))),
                  (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    }
    alternate_onto((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (re_machine *)
                   CONCAT17(in_stack_fffffffffffffc5f,
                            CONCAT16(in_stack_fffffffffffffc5e,
                                     CONCAT15(in_stack_fffffffffffffc5d,
                                              CONCAT14(in_stack_fffffffffffffc5c,
                                                       in_stack_fffffffffffffc58)))),
                   (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    if (auStack_308[(long)local_44 * 9 + 1] == 0) {
      if ((auStack_308[(long)local_44 * 9 + 3] == 0) && (auStack_308[(long)local_44 * 9 + 2] == 0))
      {
        local_40 = local_38;
      }
      else {
        build_assert(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                     (re_machine *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                     (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),(int)in_stack_fffffffffffffc68)
        ;
      }
    }
    else {
      build_group((CRegexParser *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                  (re_machine *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,
                                             CONCAT14(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)))),
                  (re_machine *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                  in_stack_fffffffffffffc4c);
    }
    local_30 = *(re_machine *)((long)local_318 + (long)local_44 * 0x24);
    local_38 = *(re_machine *)((long)local_318 + (long)local_44 * 0x24 + 8);
  } while( true );
}

Assistant:

re_status_t CRegexParser::compile(const char *expr_str, size_t exprlen,
                                  re_compiled_pattern_base *pat)
{
    re_machine cur_machine;
    re_machine alter_machine;
    re_machine new_machine;
    int group_stack_level;
    struct
    {
        re_machine old_cur;
        re_machine old_alter;
        int group_id;
        int capturing;
        int neg_assertion;
        int pos_assertion;
        int back_assertion;
    } group_stack[RE_GROUP_NESTING_MAX];
    utf8_ptr expr;

    /* reset everything */
    reset();

    /* we have no groups yet */
    pat->group_cnt = 0;

    /* we have no looping variables yet */
    pat->loop_var_cnt = 0;

    /* get the length of the expression in characters */
    size_t exprchars = utf8_ptr::s_len(expr_str, exprlen);

    /* 
     *   set the default match modes - maximum, first-beginning,
     *   case-sensitive 
     */
    pat->longest_match = TRUE;
    pat->first_begin = TRUE;
    pat->case_sensitive = TRUE;
    pat->case_sensitivity_specified = FALSE;

    /* start out with no current machine and no alternate machine */
    build_null_machine(&cur_machine);
    build_null_machine(&alter_machine);

    /* nothing on the stack yet */
    group_stack_level = 0;

    /* loop until we run out of expression to parse */
    for (expr.set((char *)expr_str) ; exprchars != 0 ; expr.inc(), --exprchars)
    {
        switch(expr.getch())
        {
        case '^':
            /*
             *   beginning of line - if we're not at the beginning of the
             *   current expression (i.e., we already have some
             *   concatentations accumulated), treat it as an ordinary
             *   character 
             */
            if (!is_machine_null(&cur_machine))
                goto normal_char;

            /* build a new start-of-text recognizer */
            build_special(&new_machine, RE_TEXT_BEGIN, 0);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            concat_onto(&cur_machine, &new_machine);
            break;

        case '$':
            /*
             *   End of line specifier - if there's anything left after
             *   the '$' other than a close parens or alternation
             *   specifier, treat it as a normal character 
             */
            if (exprchars > 1
                && (expr.getch_at(1) != ')' && expr.getch_at(1) != '|'))
                goto normal_char;

            /* build a new end-of-text recognizer */
            build_special(&new_machine, RE_TEXT_END, 0);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            concat_onto(&cur_machine, &new_machine);
            break;
            
        case '(':
            {
                int capturing;
                int pos_assertion;
                int neg_assertion;
                int back_assertion;

                /* presume it's a capturing group */
                capturing = TRUE;

                /* presume it's not an assertion */
                pos_assertion = FALSE;
                neg_assertion = FALSE;
                back_assertion = FALSE;
                
                /* 
                 *   Add a nesting level.  Push the current machine and
                 *   alternate machines onto the group stack, and clear
                 *   everything out for the new group.  
                 */
                if (group_stack_level > RE_GROUP_NESTING_MAX)
                {
                    /* we cannot proceed - return an error */
                    return RE_STATUS_GROUP_NESTING_TOO_DEEP;
                }
                
                /* save the current state on the stack */
                group_stack[group_stack_level].old_cur = cur_machine;
                group_stack[group_stack_level].old_alter = alter_machine;
                
                /* 
                 *   Assign the group a group ID - groups are numbered in
                 *   order of their opening (left) parentheses, so we want
                 *   to assign a group number now.  We won't actually need
                 *   to know the group number until we get to the matching
                 *   close paren, but we need to assign it now, so store
                 *   it in the group stack.  
                 */
                group_stack[group_stack_level].group_id = pat->group_cnt;
                
                /* check for special group flags */
                if (exprchars > 2 && expr.getch_at(1) == '?')
                {
                    switch(expr.getch_at(2))
                    {
                    case '<':
                        /* look-back assertion */
                        if (exprchars > 3
                            && (expr.getch_at(3) == '='
                                || expr.getch_at(3) == '!'))
                        {
                            /* it's a look-back assertion */
                            back_assertion = TRUE;

                            /* assertions don't capture */
                            capturing = FALSE;

                            /* note whether it's positive or negative */
                            if (expr.getch_at(3) == '=')
                                pos_assertion = TRUE;
                            else
                                neg_assertion = TRUE;

                            /* skip the '?<=' or '?<!' part */
                            expr.inc();
                            expr.inc();
                            expr.inc();
                            exprchars -= 3;
                        }
                        break;
                        
                    case ':':
                        /* it's a non-capturing group */
                        capturing = FALSE;

                        /* skip two extra characters for the '?:' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    case '=':
                        /* it's a positive assertion group */
                        pos_assertion = TRUE;

                        /* assertions don't capture */
                        capturing = FALSE;

                        /* skip two extra characters for the '?=' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    case '!':
                        /* it's a negative assertion group */
                        neg_assertion = TRUE;

                        /* assertions don't capture */
                        capturing = FALSE;

                        /* skip two extra characters for the '?!' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    default:
                        /* it's not a recognized sequence - ignore it */
                        break;
                    }
                }

                /* remember if the group is capturing */
                group_stack[group_stack_level].capturing = capturing;

                /* remember if it's an assertion of some kind */
                group_stack[group_stack_level].pos_assertion = pos_assertion;
                group_stack[group_stack_level].neg_assertion = neg_assertion;
                group_stack[group_stack_level].back_assertion = back_assertion;
                
                /* consume the group number if it's a capturing group */
                if (capturing)
                    ++(pat->group_cnt);
                
                /* push the level */
                ++group_stack_level;
                
                /* start the new group with empty machines */
                build_null_machine(&cur_machine);
                build_null_machine(&alter_machine);
            }
            break;

        case ')':
        do_close_paren:
            /* if there's nothing on the stack, ignore this */
            if (group_stack_level == 0)
                break;

            /* take a level off the stack */
            --group_stack_level;

            /* 
             *   For a lookback assertion, add the lookback parent position
             *   match assertion to the group.  This ensures that we can only
             *   match the group when the match leaves us at the same
             *   position where the lookback assertion was matched.  
             */
            if (group_stack[group_stack_level].back_assertion)
            {
                build_special(&new_machine, RE_LOOKBACK_POS, 0);
                concat_onto(&cur_machine, &new_machine);
            }

            /* 
             *   Remove a nesting level.  If we have a pending alternate
             *   expression, build the alternation expression.  This will
             *   leave the entire group expression in alter_machine,
             *   regardless of whether an alternation was in progress or
             *   not.  
             */
            alternate_onto(&alter_machine, &cur_machine);

            /*
             *   Create a group machine that encloses the group and marks
             *   it with a group number.  We assigned the group number
             *   when we parsed the open paren, so read that group number
             *   from the stack.
             *   
             *   Note that this will leave 'new_machine' with the entire
             *   group machine.
             *   
             *   If this is a non-capturing group, don't bother building
             *   the new machine - just copy the current alternation
             *   machine onto the new machine.  
             */
            if (group_stack[group_stack_level].capturing)
            {
                /* it's a regular capturing group - add the group machine */
                build_group(&new_machine, &alter_machine,
                            group_stack[group_stack_level].group_id);
            }
            else if (group_stack[group_stack_level].pos_assertion
                     || group_stack[group_stack_level].neg_assertion)
            {
                /* it's an assertion - build the assertion group */
                build_assert(&new_machine, &alter_machine,
                             group_stack[group_stack_level].neg_assertion,
                             group_stack[group_stack_level].back_assertion);
            }
            else
            {
                /* it's a non-capturing group - just add the group tree */
                new_machine = alter_machine;
            }

            /*
             *   Pop the stack - restore the alternation and current
             *   machines that were in progress before the group started. 
             */
            cur_machine = group_stack[group_stack_level].old_cur;
            alter_machine = group_stack[group_stack_level].old_alter;

            /*
             *   Check the group expression (in new_machine) for postfix
             *   expressions 
             */
            goto apply_postfix;

        case '|':
            /* 
             *   Start a new alternation.  This ends the current
             *   alternation; if we have a previous pending alternate,
             *   build an alternation machine out of the previous
             *   alternate and the current machine and move that to the
             *   alternate; otherwise, simply move the current machine to
             *   the pending alternate. 
             */
            alternate_onto(&alter_machine, &cur_machine);

            /* 
             *   the alternation starts out with a blank slate, so null
             *   out the current machine 
             */
            build_null_machine(&cur_machine);
            break;

        case '<':
            /* check for our various special directives */
            if ((exprchars >= 4 && memicmp(expr.getptr(), "<FE>", 4) == 0)
                || (exprchars >= 10
                    && memicmp(expr.getptr(), "<FirstEnd>", 10) == 0))
            {
                /* turn off first-begin mode */
                pat->first_begin = FALSE;
            }
            else if ((exprchars >= 4 && memicmp(expr.getptr(), "<FB>", 4) == 0)
                     || (exprchars >= 12
                         && memicmp(expr.getptr(), "<FirstBegin>", 12) == 0))
            {
                /* turn on first-begin mode */
                pat->first_begin = TRUE;
            }
            else if (exprchars >= 5 && memicmp(expr.getptr(), "<Max>", 5) == 0)
            {
                /* turn on longest-match mode */
                pat->longest_match = TRUE;
            }
            else if (exprchars >= 5 && memicmp(expr.getptr(), "<Min>", 5) == 0)
            {
                /* turn off longest-match mode */
                pat->longest_match = FALSE;
            }
            else if (exprchars >= 6
                     && memicmp(expr.getptr(), "<Case>", 6) == 0)
            {
                /* turn on case sensitivity */
                pat->case_sensitive = TRUE;
                pat->case_sensitivity_specified = TRUE;
            }
            else if (exprchars >= 8
                     && memicmp(expr.getptr(), "<NoCase>", 8) == 0)
            {
                /* turn off case sensitivity */
                pat->case_sensitive = FALSE;
                pat->case_sensitivity_specified = TRUE;
            }
            else
            {
                /*
                 *   It's nothing else we recognize, so it must be a
                 *   character class or class range expression, which
                 *   consists of one or more classes, single characters, or
                 *   character ranges separated by '|' delimiters.  
                 */
                if (compile_char_class_expr(&expr, &exprchars, &new_machine))
                {
                    /* success - look for postfix operators */
                    goto apply_postfix;
                }
                else
                {
                    /* 
                     *   failure - treat the whole thing as ordinary
                     *   characters 
                     */
                    goto normal_char;
                }
            }

            /* skip everything up to the closing ">" */
            while (exprchars > 0 && expr.getch() != '>')
                expr.inc(), --exprchars ;
            break;

        case '%':
            /* 
             *   quoted character - skip the quote mark and see what we
             *   have 
             */
            expr.inc();
            --exprchars;

            /* check to see if we're at the end of the expression */
            if (exprchars == 0)
            {
                /* 
                 *   end of the string - ignore it, but undo the extra
                 *   increment of the expression index so that we exit the
                 *   enclosing loop properly 
                 */
                expr.dec();
                ++exprchars;
                break;
            }

            /* see what we have */
            switch(expr.getch())
            {
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                /* group match - build a new literal group recognizer */
                build_group_matcher(&new_machine,
                                    value_of_digit(expr.getch()) - 1);

                /* apply any postfix expression to the group recognizer */
                goto apply_postfix;

            case '<':
                /* build a beginning-of-word recognizer */
                build_special(&new_machine, RE_WORD_BEGIN, 0);

                /* it can't be postfixed - just concatenate it */
                concat_onto(&cur_machine, &new_machine);
                break;

            case '>':
                /* build an end-of-word recognizer */
                build_special(&new_machine, RE_WORD_END, 0);

                /* it can't be postfixed - just concatenate it */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 'w':
                /* word character */
                build_special(&new_machine, RE_WORD_CHAR, 0);
                goto apply_postfix;

            case 'W':
                /* non-word character */
                build_special(&new_machine, RE_NON_WORD_CHAR, 0);
                goto apply_postfix;

            case 'b':
                /* word boundary */
                build_special(&new_machine, RE_WORD_BOUNDARY, 0);

                /* it can't be postfixed */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 'B':
                /* not a word boundary */
                build_special(&new_machine, RE_NON_WORD_BOUNDARY, 0);

                /* it can't be postfixed */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 's':
                /* %s -> same as <space> */
                build_special(&new_machine, RE_SPACE, 0);
                goto apply_postfix;

            case 'S':
                /* %S -> same as <^space> */
                build_special(&new_machine, RE_NON_SPACE, 0);
                goto apply_postfix;

            case 'd':
                /* %d -> same as <digit> */
                build_special(&new_machine, RE_DIGIT, 0);
                goto apply_postfix;

            case 'D':
                /* %D -> same as <^digit> */
                build_special(&new_machine, RE_NON_DIGIT, 0);
                goto apply_postfix;

            case 'v':
                /* %v -> same as <vspace> */
                build_special(&new_machine, RE_VSPACE, 0);
                goto apply_postfix;

            case 'V':
                /* %V -> same as <^vspace> */
                build_special(&new_machine, RE_NON_VSPACE, 0);
                goto apply_postfix;

            default:
                /* build a new literal character recognizer */
                build_char(&new_machine, expr.getch());

                /* apply any postfix expression to the character */
                goto apply_postfix;
            }
            break;

        case '.':
            /* 
             *   wildcard character - build a single character recognizer
             *   for the special wildcard symbol, then go check it for a
             *   postfix operator 
             */
            build_special(&new_machine, RE_WILDCARD, 0);
            goto apply_postfix;
            break;

        case '[':
            /* range expression */
            {
                int is_exclusive = FALSE;

                /* we have no entries yet */
                range_buf_cnt_ = 0;

                /* first, skip the open bracket */
                expr.inc();
                --exprchars;

                /* check to see if starts with the exclusion character */
                if (exprchars != 0 && expr.getch() == '^')
                {
                    /* skip the exclusion specifier */
                    expr.inc();
                    --exprchars;

                    /* note it */
                    is_exclusive = TRUE;
                }

                /* 
                 *   if the first character is a ']', include it in the
                 *   range 
                 */
                if (exprchars != 0 && expr.getch() == ']')
                {
                    add_range_char(']');
                    expr.inc();
                    --exprchars;
                }

                /*
                 *   if the next character is a '-', include it in the
                 *   range 
                 */
                if (exprchars != 0 && expr.getch() == '-')
                {
                    add_range_char('-');
                    expr.inc();
                    --exprchars;
                }

                /* scan the character set */
                while (exprchars != 0 && expr.getch() != ']')
                {
                    /* note this character */
                    wchar_t ch = expr.getch();

                    /* skip this character of the expression */
                    expr.inc();
                    --exprchars;

                    /* check for a range */
                    if (exprchars != 0 && expr.getch() == '-')
                    {
                        /* skip the '-' */
                        expr.inc();
                        --exprchars;
                        if (exprchars != 0)
                        {
                            /* get the other end of the range */
                            wchar_t ch2 = expr.getch();

                            /* skip the second character */
                            expr.inc();
                            --exprchars;

                            /* if the range is reversed, swap it */
                            if (ch > ch2)
                            {
                                wchar_t tmp = ch;
                                ch = ch2;
                                ch2 = tmp;
                            }

                            /* add the range */
                            add_range_char(ch, ch2);
                        }
                    }
                    else
                    {
                        /* no range - add the one-character range */
                        add_range_char(ch);
                    }
                }

                /* create a character range machine */
                build_char_range(&new_machine, is_exclusive);

                /* apply any postfix operator */
                goto apply_postfix;
            }            
            break;

        default:
        normal_char:
            /* 
             *   it's an ordinary character - build a single character
             *   recognizer machine, and then concatenate it onto any
             *   existing machine 
             */
            build_char(&new_machine, expr.getch());

        apply_postfix:
            /*
             *   Check for a postfix operator, and apply it to the machine
             *   in 'new_machine' if present.  In any case, concatenate
             *   the 'new_machine' (modified by a postix operator or not)
             *   to the current machien.  
             */
            if (exprchars > 1)
            {
                switch(expr.getch_at(1))
                {
                case '*':
                case '+':
                case '?':
                    /*
                     *   We have a postfix closure operator.  Build a new
                     *   closure machine out of 'new_machine'.  
                     */
                    {
                        /* move onto the closure operator */
                        expr.inc();
                        --exprchars;

                        /* 
                         *   if the next character is '?', it's a modifier
                         *   that indicates that we are to use the
                         *   shortest match - note it if so 
                         */
                        int shortest =
                            (exprchars > 1 && expr.getch_at(1) == '?');

                        /* build the closure machine */
                        re_machine closure_machine;
                        build_closure(&closure_machine,
                                      &new_machine, expr.getch(), shortest);
                        
                        /* replace the original machine with the closure */
                        new_machine = closure_machine;
                    }
                        
                    /* 
                     *   skip any redundant closure symbols, keeping only the
                     *   first one we saw 
                     */
                skip_closures:
                    while (exprchars > 1)
                    {
                        /* check for a simple closure suffix */
                        if (expr.getch_at(1) == '?'
                            || expr.getch_at(1) == '+'
                            || expr.getch_at(1) == '*')
                        {
                            /* skip it and keep looping */
                            expr.inc();
                            --exprchars;
                            continue;
                        }
                        
                        /* check for an interval */
                        if (expr.getch_at(1) == '{')
                        {
                            /* skip until we find the matching '}' */
                            while (exprchars > 1 && expr.getch_at(1) != '}')
                                expr.inc(), --exprchars;
                            
                            /* go back for anything that follows */
                            continue;
                        }
                        
                        /* if it's anything else, we're done discarding */
                        break;
                    }
                    break;

                case '{':
                    /* interval specifier */
                    {
                        int min_val;
                        int max_val;
                        re_machine interval_machine;
                        int shortest;
                        int var_id;

                        /* 
                         *   loops can never overlap, but can be nested;
                         *   so the only thing we have to worry about in
                         *   assigning a loop variable is the group
                         *   nesting depth 
                         */
                        var_id = group_stack_level;

                        /* note the highest variable ID we've seen */
                        if (var_id >= pat->loop_var_cnt)
                            pat->loop_var_cnt = var_id + 1;

                        /* presume neither min nor max will be specified */
                        min_val = -1;
                        max_val = -1;
                        
                        /* skip the current character and the '{' */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        
                        /* parse the minimum count, if provided */
                        min_val = parse_int(&expr, &exprchars);

                        /* if there's a comma, parse the maximum value */
                        if (exprchars >= 1 && expr.getch() == ',')
                        {
                            /* skip the ',' and parse the number */
                            expr.inc();
                            --exprchars;
                            max_val = parse_int(&expr, &exprchars);
                        }
                        else
                        {
                            /* 
                             *   there's no other value, so this is a
                             *   simple loop with the same value for min
                             *   and max 
                             */
                            max_val = min_val;
                        }

                        /* 
                         *   if we're not looking at a '}', skip
                         *   characters until we are 
                         */
                        while (exprchars != 0 && expr.getch() != '}')
                            expr.inc(&exprchars);

                        /* 
                         *   if there's a '?' following, it's a 'shortest'
                         *   modifier - note it 
                         */
                        shortest = FALSE;
                        if (exprchars > 1 && expr.getch_at(1) == '?')
                        {
                            /* note the modifier */
                            shortest = TRUE;

                            /* skip another character for the modifier */
                            expr.inc();
                            --exprchars;
                        }

                        /* set up an interval node */
                        build_interval(&interval_machine, &new_machine,
                                       min_val, max_val, var_id, shortest);

                        /* replace the original machine with the interval */
                        new_machine = interval_machine;

                        /* skip any closure modifiers that follow */
                        goto skip_closures;
                    }
                    break;
                    
                default:
                    /* no postfix operator */
                    break;
                }
            }

            /*
             *   Concatenate the new machine onto the current machine
             *   under construction.  
             */
            concat_onto(&cur_machine, &new_machine);
            break;
        }

        /* if we've run down the expression string, go no further */
        if (exprchars == 0)
            break;
    }

    /* if there are any open parens outstanding, close them */
    if (group_stack_level != 0)
        goto do_close_paren;

    /* complete any pending alternation */
    alternate_onto(&alter_machine, &cur_machine);

    /* check for and break any infinite loops */
    break_loops(&alter_machine);

    /* remove meaningless branch-to-branch transitions */
    remove_branch_to_branch(&alter_machine);

    /* consolidate consecutive character transitions into strings */
    consolidate_strings(&alter_machine);

    /* store the results in the caller's base pattern description */
    pat->machine = alter_machine;
    pat->tuple_cnt = next_state_;

    /* limit the group count to the maximum */
    if (pat->group_cnt > RE_GROUP_REG_CNT)
        pat->group_cnt = RE_GROUP_REG_CNT;

    /* limit the variable count to the maximum */
    if (pat->loop_var_cnt > RE_LOOP_VARS_MAX)
        pat->loop_var_cnt = RE_LOOP_VARS_MAX;

    /* no errors encountered */
    return RE_STATUS_SUCCESS;
}